

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O1

void LzmaDec_WriteRem(CLzmaDec *p,SizeT limit)

{
  UInt32 UVar1;
  uint uVar2;
  Byte *pBVar3;
  SizeT SVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  SizeT SVar10;
  
  uVar7 = p->remainLen;
  if (uVar7 - 1 < 0x111) {
    uVar9 = p->dicPos;
    uVar8 = limit - uVar9 & 0xffffffff;
    if ((ulong)uVar7 <= limit - uVar9) {
      uVar8 = (ulong)uVar7;
    }
    uVar6 = (uint)uVar8;
    if ((p->checkDicSize == 0) && (UVar1 = (p->prop).dicSize, UVar1 - p->processedPos <= uVar6)) {
      p->checkDicSize = UVar1;
    }
    uVar2 = p->reps[0];
    pBVar3 = p->dic;
    SVar4 = p->dicBufSize;
    p->processedPos = p->processedPos + uVar6;
    p->remainLen = uVar7 - uVar6;
    if (uVar6 != 0) {
      uVar5 = uVar9;
      do {
        SVar10 = 0;
        if (uVar5 < uVar2) {
          SVar10 = SVar4;
        }
        uVar9 = uVar5 + 1;
        pBVar3[uVar5] = pBVar3[uVar5 + (SVar10 - uVar2)];
        uVar7 = (int)uVar8 - 1;
        uVar8 = (ulong)uVar7;
        uVar5 = uVar9;
      } while (uVar7 != 0);
    }
    p->dicPos = uVar9;
  }
  return;
}

Assistant:

static void MY_FAST_CALL LzmaDec_WriteRem(CLzmaDec *p, SizeT limit)
{
  if (p->remainLen != 0 && p->remainLen < kMatchSpecLenStart)
  {
    Byte *dic = p->dic;
    SizeT dicPos = p->dicPos;
    SizeT dicBufSize = p->dicBufSize;
    unsigned len = p->remainLen;
    SizeT rep0 = p->reps[0]; /* we use SizeT to avoid the BUG of VC14 for AMD64 */
    SizeT rem = limit - dicPos;
    if (rem < len)
      len = (unsigned)(rem);

    if (p->checkDicSize == 0 && p->prop.dicSize - p->processedPos <= len)
      p->checkDicSize = p->prop.dicSize;

    p->processedPos += len;
    p->remainLen -= len;
    while (len != 0)
    {
      len--;
      dic[dicPos] = dic[dicPos - rep0 + (dicPos < rep0 ? dicBufSize : 0)];
      dicPos++;
    }
    p->dicPos = dicPos;
  }
}